

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

bool wasm::canTurnIfIntoBrIf
               (Expression *ifCondition,Expression *brValue,PassOptions *options,Module *wasm)

{
  bool bVar1;
  undefined1 local_2e8 [8];
  EffectAnalyzer value;
  
  if ((ifCondition->type).id == 1) {
    bVar1 = false;
  }
  else if (brValue == (Expression *)0x0) {
    bVar1 = true;
  }
  else {
    EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_2e8,options,wasm,brValue);
    bVar1 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_2e8);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)
                 &value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,options,
                 wasm,ifCondition);
      bVar1 = EffectAnalyzer::invalidates
                        ((EffectAnalyzer *)
                         &value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (EffectAnalyzer *)local_2e8);
      bVar1 = !bVar1;
      EffectAnalyzer::~EffectAnalyzer
                ((EffectAnalyzer *)
                 &value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_2e8);
  }
  return bVar1;
}

Assistant:

static bool canTurnIfIntoBrIf(Expression* ifCondition,
                              Expression* brValue,
                              PassOptions& options,
                              Module& wasm) {
  // if the if isn't even reached, this is all dead code anyhow
  if (ifCondition->type == Type::unreachable) {
    return false;
  }
  if (!brValue) {
    return true;
  }
  EffectAnalyzer value(options, wasm, brValue);
  if (value.hasSideEffects()) {
    return false;
  }
  return !EffectAnalyzer(options, wasm, ifCondition).invalidates(value);
}